

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# otsshihua_test.cc
# Opt level: O0

int main(void)

{
  test_delete_instance();
  test_get_instance();
  test_insert_instance();
  test_list_instance();
  return 0;
}

Assistant:

int main() {
  test_delete_instance();
  test_get_instance();
  test_insert_instance();
  test_list_instance();
}